

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabCloseMethod(sqlite3_vtab_cursor *pCursor)

{
  Fts5VocabCursor *pCsr;
  sqlite3_vtab_cursor *pCursor_local;
  
  fts5VocabResetCursor((Fts5VocabCursor *)pCursor);
  sqlite3Fts5BufferFree((Fts5Buffer *)(pCursor + 0xb));
  sqlite3_finalize((sqlite3_stmt *)pCursor[1].pVtab);
  sqlite3_free(pCursor);
  return 0;
}

Assistant:

static int fts5VocabCloseMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  fts5VocabResetCursor(pCsr);
  sqlite3Fts5BufferFree(&pCsr->term);
  sqlite3_finalize(pCsr->pStmt);
  sqlite3_free(pCsr);
  return SQLITE_OK;
}